

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURL * Qiniu_Client_reset(Qiniu_Client *self)

{
  CURL *pCVar1;
  
  pCVar1 = self->curl;
  curl_easy_reset(pCVar1);
  Qiniu_Buffer_Reset(&self->b);
  Qiniu_Buffer_Reset(&self->respHeader);
  if (self->root != (cJSON *)0x0) {
    cJSON_Delete(self->root);
    self->root = (Qiniu_Json *)0x0;
  }
  curl_easy_setopt(pCVar1,99,1);
  return pCVar1;
}

Assistant:

CURL *Qiniu_Client_reset(Qiniu_Client *self)
{
    CURL *curl = (CURL *)self->curl;

    curl_easy_reset(curl);
    Qiniu_Buffer_Reset(&self->b);
    Qiniu_Buffer_Reset(&self->respHeader);
    if (self->root != NULL)
    {
        cJSON_Delete(self->root);
        self->root = NULL;
    }

    // Set this option to allow multi-threaded application to get signals, etc
    // Setting CURLOPT_NOSIGNAL to 1 makes libcurl NOT ask the system to ignore SIGPIPE signals
    // See also https://curl.haxx.se/libcurl/c/CURLOPT_NOSIGNAL.html
    // FIXED by fengyh 2017-03-22 10:30
    curl_easy_setopt(curl, CURLOPT_NOSIGNAL, 1);

    return curl;
}